

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O0

QString * Html::spanZebra(QString *__return_storage_ptr__,QStringList *text,QString *color,
                         QString *background,QString *altBackground)

{
  long lVar1;
  qsizetype qVar2;
  const_reference text_;
  QString *local_c0;
  QString local_90;
  QString local_68;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  QStringList result;
  QString *altBackground_local;
  QString *background_local;
  QString *color_local;
  QStringList *text_local;
  
  result.d.size = (qsizetype)altBackground;
  QList<QString>::QList((QList<QString> *)local_48);
  for (local_4c = 0; lVar1 = (long)local_4c, qVar2 = QList<QString>::size(text), lVar1 < qVar2;
      local_4c = local_4c + 1) {
    text_ = QList<QString>::operator[](text,(long)local_4c);
    local_c0 = background;
    if (local_4c % 2 != 0) {
      local_c0 = (QString *)result.d.size;
    }
    span(&local_68,text_,color,local_c0);
    QList<QString>::operator<<((QList<QString> *)local_48,&local_68);
    QString::~QString(&local_68);
  }
  QString::QString(&local_90,"");
  QListSpecialMethods<QString>::join
            (__return_storage_ptr__,(QListSpecialMethods<QString> *)local_48,&local_90);
  QString::~QString(&local_90);
  QList<QString>::~QList((QList<QString> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

QString Html::spanZebra(const QStringList& text, const QString& color, const QString& background, const QString& altBackground)
{
    QStringList result;
    for(int i=0;i<text.size();i++) {
        result << span(text[i],color,i % 2 ? altBackground : background);
    }
    return result.join("");
}